

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O3

void __thiscall
kj::_::Debug::Fault::
Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,long>&,unsigned_long&,unsigned_char*&,long>
          (Fault *this,char *file,int line,Type code,char *condition,char *macroArgs,
          DebugComparison<unsigned_long_&,_long> *params,unsigned_long *params_1,uchar **params_2,
          long *params_3)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 *puVar3;
  undefined4 in_register_00000014;
  unsigned_long *params_00;
  uchar **params_01;
  long *params_02;
  long lVar4;
  String argValues [4];
  long *plVar5;
  undefined8 uVar6;
  long local_a8 [3];
  String local_90;
  String local_78;
  String local_60;
  long local_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  this->exception = (Exception *)0x0;
  _::operator*(&local_48,params,CONCAT44(in_register_00000014,line));
  local_a8[0] = local_48;
  local_a8[1] = local_40;
  local_a8[2] = uStack_38;
  str<unsigned_long&>(&local_90,(kj *)params_1,params_00);
  str<unsigned_char*&>(&local_78,(kj *)params_2,params_01);
  str<long&>(&local_60,(kj *)params_3,params_02);
  plVar5 = local_a8;
  uVar6 = 4;
  init(this,(EVP_PKEY_CTX *)file);
  lVar4 = 0x48;
  do {
    lVar1 = *(long *)((long)local_a8 + lVar4);
    if (lVar1 != 0) {
      uVar2 = *(undefined8 *)((long)local_a8 + lVar4 + 8);
      *(undefined8 *)((long)local_a8 + lVar4) = 0;
      *(undefined8 *)((long)local_a8 + lVar4 + 8) = 0;
      puVar3 = *(undefined8 **)((long)local_a8 + lVar4 + 0x10);
      (**(code **)*puVar3)(puVar3,lVar1,1,uVar2,uVar2,0,plVar5,uVar6);
    }
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  return;
}

Assistant:

Debug::Fault::Fault(const char* file, int line, Code code,
                    const char* condition, const char* macroArgs, Params&&... params)
    : exception(nullptr) {
  String argValues[sizeof...(Params)] = {str(params)...};
  init(file, line, code, condition, macroArgs,
       arrayPtr(argValues, sizeof...(Params)));
}